

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManMonitor.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::DataManMonitor::AddLatencyMilliseconds
          (DataManMonitor *this,uint64_t remoteStamp)

{
  long lVar1;
  uint64_t latency;
  value_type_conflict9 local_18;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  local_18 = lVar1 / 1000000 - (remoteStamp + this->m_ClockError);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::push_back
            (&this->m_LatencyMilliseconds,&local_18);
  this->m_AccumulatedLatency =
       ((double)CONCAT44(0x45300000,(int)(local_18 >> 0x20)) - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)local_18) - 4503599627370496.0) +
       this->m_AccumulatedLatency;
  return;
}

Assistant:

void DataManMonitor::AddLatencyMilliseconds(const uint64_t remoteStamp)
{
    uint64_t localStamp = std::chrono::duration_cast<std::chrono::milliseconds>(
                              std::chrono::system_clock::now().time_since_epoch())
                              .count();
    uint64_t latency = localStamp - remoteStamp - m_ClockError;
    m_LatencyMilliseconds.push_back(latency);
    m_AccumulatedLatency += latency;
}